

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint min_new_capacity;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int c;
  long lVar7;
  byte bVar8;
  int t;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uchar uVar13;
  uchar uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  color_cluster *pcVar22;
  bool bVar23;
  float fVar24;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  int scan [3];
  results results;
  int refine [4];
  etc1_optimizer optimizer;
  undefined4 local_23c;
  elemental_vector local_238;
  dxt_hc *local_228;
  undefined4 local_220;
  undefined2 local_21c;
  uint local_218;
  color_quad<unsigned_char,_int> *local_210;
  undefined1 local_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  unsigned_long_long *local_1d8;
  uchar *local_1d0;
  float *local_1c8;
  uint *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  long local_190;
  uchar *local_188;
  undefined8 local_180;
  undefined4 local_178;
  ulong local_170;
  byte abStack_168 [4];
  uint local_164;
  uint local_160;
  void *local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  etc1_optimizer local_138;
  
  local_1e8 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  local_180 = 0xffffffff;
  local_178 = 1;
  local_148 = 0xfffffffd;
  uStack_144 = 0xfffffffe;
  uStack_140 = 2;
  uStack_13c = 3;
  uVar21 = (ulong)(this->m_color_clusters).m_size;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1e8;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar21 * data;
  local_1e8 = ((data + 1) * uVar21) / local_1e8;
  if (SUB164(auVar6 / auVar5,0) < (uint)local_1e8) {
    uVar21 = SUB168(auVar6 / auVar5,0) & 0xffffffff;
    local_1e8 = local_1e8 & 0xffffffff;
    local_228 = this;
    do {
      pcVar22 = (local_228->m_color_clusters).m_p;
      if (pcVar22[uVar21].pixels.m_size != 0) {
        pcVar22 = pcVar22 + uVar21;
        local_138.m_best_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_best_solution.m_selectors.m_size = 0;
        local_138.m_best_solution.m_selectors.m_capacity = 0;
        local_138.m_sorted_luma[1].m_p = (uint *)0x0;
        local_138.m_sorted_luma[1].m_size = 0;
        local_138.m_sorted_luma[1].m_capacity = 0;
        local_138.m_sorted_luma[0].m_p = (uint *)0x0;
        local_138.m_sorted_luma[0].m_size = 0;
        local_138.m_sorted_luma[0].m_capacity = 0;
        local_138.m_luma.m_p = (unsigned_short *)0x0;
        local_138.m_luma.m_size = 0;
        local_138.m_luma.m_capacity = 0;
        local_138.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
        local_138.m_best_solution.m_coords._1_8_ = 0;
        local_138.m_best_selectors.m_p = (uchar *)0x0;
        local_138.m_best_selectors.m_size._0_1_ = 0;
        local_138.m_best_selectors._9_7_ = 0;
        local_138.m_selectors.m_p = (uchar *)0x0;
        local_138.m_selectors.m_size = 0;
        local_138.m_selectors.m_capacity = 0;
        local_138.m_best_solution.m_error = 0xffffffffffffffff;
        local_138.m_best_solution.m_valid = false;
        local_138.m_trial_solution.m_coords.m_color4 = false;
        local_138.m_trial_solution.m_coords.m_unscaled_color.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        local_138.m_trial_solution.m_coords.m_inten_table = 0;
        local_138.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_trial_solution.m_selectors.m_size = 0;
        local_138.m_trial_solution.m_selectors.m_capacity = 0;
        local_138.m_trial_solution.m_error = 0xffffffffffffffff;
        local_138.m_trial_solution.m_valid = false;
        local_138.m_temp_selectors.m_p = (uchar *)0x0;
        local_138.m_temp_selectors.m_size = 0;
        local_138.m_temp_selectors.m_capacity = 0;
        local_138.m_pParams = (params *)0x0;
        local_138.m_pResult = (results *)0x0;
        local_138.m_pSorted_luma_indices = (uint32 *)0x0;
        local_138.m_pSorted_luma = (uint32 *)0x0;
        local_220 = 2;
        local_21c = 1;
        local_218 = 0;
        local_210 = (color_quad<unsigned_char,_int> *)0x0;
        local_200 = (undefined8 *)
                    &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
        local_1f8 = 1;
        local_208 = 0;
        local_1f0 = 0;
        min_new_capacity = (pcVar22->pixels).m_size;
        local_238.m_p = (void *)0x0;
        local_238.m_size = 0;
        local_238.m_capacity = 0;
        if (min_new_capacity != 0) {
          elemental_vector::increase_capacity
                    (&local_238,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
          memset((void *)((local_238._8_8_ & 0xffffffff) + (long)local_238.m_p),0,
                 (ulong)(min_new_capacity - local_238.m_size));
          local_238.m_size = min_new_capacity;
        }
        local_210 = (pcVar22->pixels).m_p;
        local_218 = (pcVar22->pixels).m_size;
        local_160 = local_218;
        local_158 = local_238.m_p;
        etc1_optimizer::init(&local_138,(EVP_PKEY_CTX *)&local_220);
        local_200 = &local_180;
        local_1f8._0_4_ = 3;
        etc1_optimizer::compute(&local_138);
        if (local_218 * 0x177 < local_170) {
          local_200 = (undefined8 *)&local_148;
          local_1f8._0_4_ = 4;
          etc1_optimizer::compute(&local_138);
        }
        lVar7 = 0;
        do {
          *(byte *)((long)&local_23c + lVar7) = abStack_168[lVar7] >> 2 | abStack_168[lVar7] * '\b';
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_23c = CONCAT13((char)local_164,(undefined3)local_23c);
        pcVar22->first_endpoint = local_23c;
        bVar8 = (&DAT_001b0770)[(ulong)(local_164 & 0xff) * 2];
        bVar1 = (&DAT_001b0771)[(ulong)(local_164 & 0xff) * 2];
        lVar7 = 0;
        do {
          bVar2 = *(byte *)((long)&local_23c + lVar7);
          uVar14 = bVar2 - bVar1;
          if (bVar2 < bVar1) {
            uVar14 = '\0';
          }
          pcVar22->color_values[0].field_0.c[lVar7] = uVar14;
          uVar14 = bVar2 - bVar8;
          if (bVar2 < bVar8) {
            uVar14 = '\0';
          }
          pcVar22->color_values[1].field_0.c[lVar7] = uVar14;
          uVar14 = bVar8 + bVar2;
          if (CARRY1(bVar8,bVar2)) {
            uVar14 = 0xff;
          }
          uVar13 = bVar2 + bVar1;
          if (CARRY1(bVar2,bVar1)) {
            uVar13 = 0xff;
          }
          pcVar22->color_values[2].field_0.c[lVar7] = uVar14;
          pcVar22->color_values[3].field_0.c[lVar7] = uVar13;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar7 = 4;
        lVar9 = 0;
        do {
          pcVar22->color_values[lVar9].field_0.field_0.a = 0xff;
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        fVar24 = (float)(int)(((uint)pcVar22->color_values[3].field_0.field_0.b * 0x1d2f + 0x8000 +
                               (uint)pcVar22->color_values[3].field_0.field_0.g * 0x9646 +
                               (uint)pcVar22->color_values[3].field_0.field_0.r * 0x4c8b >> 0x10) -
                             ((uint)pcVar22->color_values[0].field_0.field_0.b * 0x1d2f + 0x8000 +
                              (uint)pcVar22->color_values[0].field_0.field_0.g * 0x9646 +
                              (uint)pcVar22->color_values[0].field_0.field_0.r * 0x4c8b >> 0x10)) /
                 100.0;
        if (1.0 <= fVar24) {
          fVar24 = 1.0;
        }
        local_1e0 = uVar21;
        fVar24 = powf(fVar24,2.7);
        local_1b8 = (ulong)pcVar22->blocks[0].m_size;
        if (local_1b8 != 0) {
          bVar3 = local_228->m_has_subblocks;
          local_1c0 = pcVar22->blocks[0].m_p;
          local_1c8 = (local_228->m_block_weights).m_p;
          local_1d0 = (local_228->m_block_encodings).m_p;
          bVar4 = (local_228->m_params).m_perceptual;
          local_1d8 = local_228->m_block_selectors[0].m_p;
          local_190 = (ulong)(bVar3 ^ 1) * 8 + 8;
          uVar21 = 0;
          do {
            local_198 = uVar21;
            local_1a0 = (ulong)local_1c0[local_198];
            local_188 = (*local_228->m_blocks)[0].field_0.c + (local_1a0 << (6U - bVar3 & 0x3f));
            local_1b0 = (ulong)(local_1c8[local_1a0] * fVar24 * 32768.0 *
                               *(float *)(&DAT_001b07b0 + (ulong)(local_1d0[local_1a0] == '\0') * 4)
                               );
            local_1a8 = 0xffff;
            if ((uint)local_1b0 < 0xffff) {
              local_1a8 = local_1b0 & 0xffffffff;
            }
            lVar7 = 0;
            uVar19 = 0;
            do {
              uVar17 = 0xffffffff;
              uVar10 = 0;
              uVar21 = 0;
              do {
                iVar12 = (uint)local_188[lVar7 * 4] -
                         (uint)pcVar22->color_values[uVar10].field_0.field_0.r;
                iVar11 = (uint)local_188[lVar7 * 4 + 1] -
                         (uint)pcVar22->color_values[uVar10].field_0.field_0.g;
                iVar15 = (uint)local_188[lVar7 * 4 + 2] -
                         (uint)pcVar22->color_values[uVar10].field_0.field_0.b;
                bVar23 = bVar4 == false;
                iVar20 = iVar11 * 0x19;
                if (bVar23) {
                  iVar20 = iVar11;
                }
                iVar18 = iVar12 * 8;
                if (bVar23) {
                  iVar18 = iVar12;
                }
                uVar16 = iVar15 * iVar15 + iVar18 * iVar12 + iVar20 * iVar11;
                bVar23 = uVar16 < uVar17;
                if (bVar23) {
                  uVar17 = uVar16;
                }
                uVar21 = uVar21 & 0xff;
                if (bVar23) {
                  uVar21 = uVar10 & 0xffffffff;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != 4);
              uVar19 = (uint)uVar21 & 0xff | uVar19 << 2;
              lVar7 = lVar7 + 1;
            } while (lVar7 != local_190);
            uVar21 = local_1a8;
            if ((uint)local_1b0 == 0) {
              uVar21 = 1;
            }
            bVar8 = bVar3 << 4 | 0x20;
            if ((local_1c0[local_198] & 1) != 0) {
              bVar8 = 0x20;
            }
            local_1d8[local_1a0] = uVar21 | (ulong)uVar19 << (bVar8 & 0x3f);
            uVar21 = local_198 + 1;
          } while (local_198 + 1 != local_1b8);
        }
        if (local_238.m_p != (void *)0x0) {
          crnlib_free(local_238.m_p);
        }
        etc1_optimizer::~etc1_optimizer(&local_138);
        uVar21 = local_1e0;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_1e8);
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint8 delta[8][2] = { { 2, 8 }, { 5, 17 }, { 9, 29 }, { 13, 42 }, { 18, 60 }, { 24, 80 }, { 33, 106 }, { 47, 183 } };
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };
        for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++)
        {
            color_cluster& cluster = m_color_clusters[iCluster];
            if (cluster.pixels.size())
            {
                etc1_optimizer optimizer;
                etc1_optimizer::params params;
                params.m_use_color4 = false;
                params.m_constrain_against_base_color5 = false;
                etc1_optimizer::results results;
                crnlib::vector<uint8> selectors(cluster.pixels.size());
                params.m_pSrc_pixels = cluster.pixels.get_ptr();
                results.m_pSelectors = selectors.get_ptr();
                results.m_n = params.m_num_src_pixels = cluster.pixels.size();
                optimizer.init(params, results);
                params.m_pScan_deltas = scan;
                params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                optimizer.compute();
                if (results.m_error > 375 * params.m_num_src_pixels)
                {
                    params.m_pScan_deltas = refine;
                    params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                    optimizer.compute();
                }
                color_quad_u8 endpoint;
                for (int c = 0; c < 3; c++)
                {
                    endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
                }
                endpoint.c[3] = results.m_block_inten_table;
                cluster.first_endpoint = endpoint.m_u32;
                for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++)
                {
                    uint8 q = endpoint.c[c];
                    cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
                    cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
                    cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
                    cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
                }
                for (int t = 0; t < 4; t++)
                {
                    cluster.color_values[t].c[3] = 0xFF;
                }
                float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

                crnlib::vector<uint>& blocks = cluster.blocks[cColor];
                uint blockSize = m_has_subblocks ? 8 : 16;
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
                    uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
                    uint32 selector = 0;
                    for (uint p = 0; p < blockSize; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 s = 0; s < 4; s++)
                        {
                            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 2 | s_best;
                    }
                    m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
                }
            }
        }
    }